

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
helics::ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,data_view *block)

{
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::convertFromBinary((byte *)(block->dblock)._M_str,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static X interpret(const data_view& block)
    {
        X val;
        detail::convertFromBinary(block.bytes(), val);
        return val;
    }